

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::Base64EscapeInternal
               (uchar *src,int szsrc,string *dest,bool do_padding,char *base64_chars)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  pointer dest_00;
  
  bVar1 = (char)(szsrc / 3) * '\x04';
  if (szsrc % 3 != 0) {
    if (szsrc % 3 == 1) {
      bVar3 = bVar1 | 2;
    }
    else {
      bVar3 = bVar1 | 3;
    }
    bVar1 = bVar1 + 4;
    if (!do_padding) {
      bVar1 = bVar3;
    }
  }
  dest_00 = (char *)0x0;
  std::__cxx11::string::resize((ulong)dest,bVar1);
  if (dest->_M_string_length != 0) {
    dest_00 = (dest->_M_dataplus)._M_p;
  }
  iVar2 = Base64EscapeInternal
                    (src,szsrc,dest_00,(int)dest->_M_string_length,base64_chars,do_padding);
  uVar4 = (ulong)iVar2;
  if (uVar4 <= dest->_M_string_length) {
    dest->_M_string_length = uVar4;
    (dest->_M_dataplus)._M_p[uVar4] = '\0';
    return;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase");
}

Assistant:

void Base64EscapeInternal(const unsigned char* src, int szsrc,
                          string* dest, bool do_padding,
                          const char* base64_chars) {
  const int calc_escaped_size =
    CalculateBase64EscapedLen(szsrc, do_padding);
  dest->resize(calc_escaped_size);
  const int escaped_len = Base64EscapeInternal(src, szsrc,
                                               string_as_array(dest),
                                               dest->size(),
                                               base64_chars,
                                               do_padding);
  GOOGLE_DCHECK_EQ(calc_escaped_size, escaped_len);
  dest->erase(escaped_len);
}